

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_40 [4];
  
  open(this,__file,__oflag);
  std::__cxx11::string::string((string *)local_40,(string *)&this->path_);
  iVar1 = ::unlink(local_40[0]);
  iVar2 = std::__cxx11::string::~string((string *)local_40);
  if (iVar1 != -1) {
    return iVar2;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  std::__cxx11::string::string((string *)&local_60,(string *)__file);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar1,"Unable to create temporary file in directory",&local_60);
}

Assistant:

void file_handle::open (temporary const, std::string const & directory) {
            this->open (unique{}, directory);
            if (::unlink (this->path ().c_str ()) == -1) {
                int const err = errno;
                raise_file_error (err, "Unable to create temporary file in directory", directory);
            }
        }